

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall MobileElementManager::Insert(MobileElementManager *this,Ptr *pol,Ptr *polymer)

{
  pointer ppVar1;
  pointer pdVar2;
  _Base_ptr p_Var3;
  pointer pdVar4;
  const_iterator cVar5;
  bool bVar6;
  SpeciesTracker *pSVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  runtime_error *this_00;
  difference_type __d;
  ulong uVar10;
  const_iterator __position;
  _Base_ptr __lhs;
  ulong uVar11;
  double local_a8;
  string codon;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> pol_polymer;
  
  std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>::
  pair<std::shared_ptr<MobileElement>_&,_std::shared_ptr<Polymer>_&,_true>(&pol_polymer,pol,polymer)
  ;
  __position._M_current =
       (this->polymerases_).
       super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (long)(this->polymerases_).
                 super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current >> 5;
  while (0 < (long)uVar11) {
    uVar10 = uVar11 >> 1;
    std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>::pair
              ((pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *)&codon,
               &pol_polymer);
    std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>::pair
              ((pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *)&local_70,
               __position._M_current + uVar10);
    uVar11 = ~uVar10 + uVar11;
    cVar5._M_current = __position._M_current + uVar10 + 1;
    if (*(int *)(codon._M_dataplus._M_p + 0x38) < *(int *)(local_70._M_dataplus._M_p + 0x38)) {
      uVar11 = uVar10;
      cVar5._M_current = __position._M_current;
    }
    __position._M_current = cVar5._M_current;
    std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>::~pair
              ((pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *)&local_70);
    std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>::~pair
              ((pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *)&codon);
  }
  ppVar1 = (this->polymerases_).
           super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar2 = (this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>::
  pair<std::shared_ptr<MobileElement>_&,_std::shared_ptr<Polymer>_&,_true>
            ((pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *)&codon,pol,polymer);
  std::
  vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ::_M_insert_rval(&this->polymerases_,__position,(value_type *)&codon);
  std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>::~pair
            ((pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *)&codon);
  pSVar7 = SpeciesTracker::Instance();
  bVar6 = std::operator==(&((pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->name_,"__ribosome");
  if ((bVar6) && ((pSVar7->codon_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    std::__cxx11::string::substr((ulong)&codon,(ulong)&this->seq_);
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::find(&(pSVar7->codon_map_)._M_t,&codon);
    __lhs = *(_Base_ptr *)(cVar8._M_node + 2);
    p_Var3 = cVar8._M_node[2]._M_parent;
    local_a8 = 0.0;
    for (; __lhs != p_Var3; __lhs = __lhs + 1) {
      std::operator+(&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     "_charged");
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&(pSVar7->species_)._M_t,&local_70);
      local_a8 = local_a8 + (double)(int)cVar9._M_node[2]._M_color;
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string((string *)&codon);
  }
  else {
    bVar6 = std::operator==(&((pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->name_,"__ribosome");
    local_a8 = 1.0;
    if ((bVar6) &&
       (pdVar4 = (this->weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
       pdVar4 != (this->weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish)) {
      local_a8 = pdVar4[(long)((pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->stop_ + -1] + 0.0;
    }
  }
  codon._M_dataplus._M_p =
       (pointer)(local_a8 *
                ((pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                speed_);
  this->prop_sum_ = this->prop_sum_ + (double)codon._M_dataplus._M_p;
  std::vector<double,_std::allocator<double>_>::_M_insert_rval
            (&this->prop_list_,
             (double *)(((long)__position._M_current - (long)ppVar1 >> 2) + (long)pdVar2),
             (value_type_conflict1 *)&codon);
  if ((long)(this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 ==
      (long)(this->polymerases_).
            super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->polymerases_).
            super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    bVar6 = std::operator!=(&((pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->name_,"__rnase");
    if (bVar6) {
      this->pol_count_ = this->pol_count_ + 1;
    }
    std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>::~pair(&pol_polymer);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Prop list not correct size.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MobileElementManager::Insert(MobileElement::Ptr pol,
                                  Polymer::Ptr polymer) {
  // Find where in vector polymerase should insert; use a lambda function
  // to make comparison between polymerase pointers
  auto pol_polymer = std::make_pair(pol, polymer);
  auto it =
      std::upper_bound(polymerases_.begin(), polymerases_.end(), pol_polymer,
                       [](std::pair<MobileElement::Ptr, Polymer::Ptr> a,
                          std::pair<MobileElement::Ptr, Polymer::Ptr> b) {
                         return a.first->start() < b.first->start();
                       });
  // Record position for prop_list_
  // NOTE: iterators become invalid as soon as a vector is changed!!
  // Attempting to use an iterator twice will lead to a segfault.
  auto prop_it = (it - polymerases_.begin()) + prop_list_.begin();
  // Add polymerase to this polymer
  polymerases_.insert(it, std::make_pair(pol, polymer));
  
  //Set propensity
  double weight = 1;
  auto &tracker = SpeciesTracker::Instance();
  if (pol->name() == "__ribosome" && !tracker.codon_map().empty()) { 
    weight--;
    /**
     * Steps:
     * 1. get pol position, codon from indexing sequence
     * 2. get anticodon(s) from codon-anticodon map
     * 3. get the total number of available tRNAs
     */
    std::string codon = seq_.substr(pol->stop(), 3);
    //std::cout << codon << std::endl;
    //std::cout << pol->stop() << std::endl;
    auto anticodons = tracker.codon_map().find(codon);
    for (auto const& anticodon : anticodons->second) {
      //std::cout << anticodon << std::endl;
      weight += tracker.species().find(anticodon + "_charged")->second;
    } 
  } else if (pol->name() == "__ribosome" && !weights_.empty()) {
      weight--;
      // weight propensity by index
      weight += weights_[pol->stop() - 1];
  }
  // Update total move propensity of this polymer
  prop_sum_ += weight * pol->speed();
  prop_list_.insert(prop_it, weight * pol->speed());

  if (prop_list_.size() != polymerases_.size()) {
    throw std::runtime_error("Prop list not correct size.");
  }
  // Keep running count of non-RNAse mobile elements
  if (pol->name() != "__rnase") {
    pol_count_ += 1;
  }
}